

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_mm_len(jit_State *J,TRef tr,TValue *tv)

{
  int iVar1;
  BCReg func_00;
  TRef *pTVar2;
  TValue *pTVar3;
  TValue *basev;
  TRef *base;
  TValue TStack_f8;
  BCReg func;
  RecordIndex ix;
  TValue *tv_local;
  TRef tr_local;
  jit_State *J_local;
  
  TStack_f8 = *tv;
  ix.oldv._0_4_ = tr;
  ix._64_8_ = tv;
  iVar1 = lj_record_mm_lookup(J,(RecordIndex *)&stack0xffffffffffffff08,MM_FAST);
  if (iVar1 != 0) {
    func_00 = rec_mm_prep(J,lj_cont_ra);
    pTVar2 = J->base + func_00;
    pTVar3 = J->L->base + func_00;
    *pTVar2 = ix.val;
    *pTVar3 = ix.valv;
    pTVar2[2] = tr;
    pTVar3[2] = *(TValue *)ix._64_8_;
    pTVar2[3] = 0x7fff;
    pTVar3[3].u64 = 0xffffffffffffffff;
    lj_record_call(J,func_00,2);
    return 0;
  }
  lj_trace_err(J,LJ_TRERR_NOMM);
}

Assistant:

static TRef rec_mm_len(jit_State *J, TRef tr, TValue *tv)
{
  RecordIndex ix;
  ix.tab = tr;
  copyTV(J->L, &ix.tabv, tv);
  if (lj_record_mm_lookup(J, &ix, MM_len)) {
    BCReg func = rec_mm_prep(J, lj_cont_ra);
    TRef *base = J->base + func;
    TValue *basev = J->L->base + func;
    base[0] = ix.mobj; copyTV(J->L, basev+0, &ix.mobjv);
    base += LJ_FR2;
    basev += LJ_FR2;
    base[1] = tr; copyTV(J->L, basev+1, tv);
#if LJ_52
    base[2] = tr; copyTV(J->L, basev+2, tv);
#else
    base[2] = TREF_NIL; setnilV(basev+2);
#endif
    lj_record_call(J, func, 2);
  } else {
    if (LJ_52 && tref_istab(tr))
      return emitir(IRTI(IR_ALEN), tr, TREF_NIL);
    lj_trace_err(J, LJ_TRERR_NOMM);
  }
  return 0;  /* No result yet. */
}